

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acftest.c
# Opt level: O2

int main(void)

{
  int iVar1;
  FILE *__stream;
  double *vec;
  long lVar2;
  double *par;
  ulong uVar3;
  long lVar4;
  double dStack_25b8;
  double temp [1200];
  
  __stream = fopen("../data/seriesC.txt","r");
  if (__stream != (FILE *)0x0) {
    uVar3 = 0;
    lVar4 = 0;
    while( true ) {
      iVar1 = feof(__stream);
      if (iVar1 != 0) break;
      __isoc99_fscanf(__stream,"%lf \n",(long)temp + (uVar3 - 8));
      lVar4 = lVar4 + 1;
      uVar3 = uVar3 + 8;
    }
    vec = (double *)malloc(uVar3 & 0x7fffffff8);
    for (lVar2 = 0; lVar4 != lVar2; lVar2 = lVar2 + 1) {
      vec[lVar2] = temp[lVar2 + -1];
    }
    par = (double *)malloc(0x50);
    puts("\n Default Method : acvf ");
    iVar1 = (int)lVar4;
    acvf(vec,iVar1,par,10);
    for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
      printf("%g ",par[lVar4]);
    }
    putchar(10);
    puts("\n acvf_opt Method 0 General Method ");
    acvf_opt(vec,iVar1,0,par,10);
    for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
      printf("%g ",par[lVar4]);
    }
    putchar(10);
    puts("\n acvf_opt Method 1 FFT ");
    acvf_opt(vec,iVar1,1,par,10);
    for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
      printf("%g ",par[lVar4]);
    }
    puts("\n ");
    puts("Autocorrelation ");
    acvf2acf(par,10);
    for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
      printf("%g ",par[lVar4]);
    }
    putchar(10);
    free(vec);
    free(par);
    return 0;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

int main(void) {
	int i, N, M;
	double *inp, *acf;
	int method;

	/*
	acvf and acvf_opt functions will calculate autocovariance from lag 0 to lag M-1
	*/

	FILE *ifp;
	double temp[1200];

	ifp = fopen("../data/seriesC.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i;

	inp = (double*)malloc(sizeof(double)* N);
	//wmean = mean(temp, N);

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
		//printf("%g \n",inp[i]);
	}

	M = 10;
	acf = (double*)malloc(sizeof(double)* M);

	// Default Method

	printf("\n Default Method : acvf \n");

	acvf(inp, N, acf, M);

	for (i = 0; i < M; ++i) {
		printf("%g ", acf[i]);
	}
	printf("\n");

	// acvf_opt : Method 0 General Method
	method = 0;
	printf("\n acvf_opt Method 0 General Method \n");
	acvf_opt(inp, N, method, acf, M);

	for (i = 0; i < M; ++i) {
		printf("%g ", acf[i]);
	}

	printf("\n");
	// acvf_opt : Method 1 FFT
	method = 1;
	printf("\n acvf_opt Method 1 FFT \n");
	acvf_opt(inp, N, method, acf, M);

	for (i = 0; i < M; ++i) {
		printf("%g ", acf[i]);
	}
	printf("\n \n");

	// Calculate Autocorrelation from already caluclated Covariance function
	printf("Autocorrelation \n");
	acvf2acf(acf, M);

	for (i = 0; i < M; ++i) {
		printf("%g ", acf[i]);
	}
	printf("\n");

	free(inp);
	free(acf);
	return 0;

}